

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecMult.c
# Opt level: O2

Vec_Int_t * Acec_MultCollectInputs(Vec_Int_t *vPairs,Vec_Int_t *vRanks,int iObj)

{
  int iVar1;
  int iVar2;
  int Entry;
  Vec_Int_t *p;
  int i;
  
  p = Vec_IntAlloc(100);
  for (i = 1; i < vPairs->nSize; i = i + 2) {
    iVar1 = Vec_IntEntry(vPairs,i + -1);
    iVar2 = Vec_IntEntry(vPairs,i);
    Entry = iVar2;
    if ((iVar1 == iObj) || (Entry = iVar1, iVar2 == iObj)) {
      Vec_IntPushUnique(p,Entry);
    }
  }
  Vec_IntSelectSortCost(p->pArray,p->nSize,vRanks);
  return p;
}

Assistant:

Vec_Int_t * Acec_MultCollectInputs( Vec_Int_t * vPairs, Vec_Int_t * vRanks, int iObj )
{
    Vec_Int_t * vItems = Vec_IntAlloc( 100 );
    int k, iObj1, iObj2;
    // collect all those appearing with this one
    Vec_IntForEachEntryDouble( vPairs, iObj1, iObj2, k )
        if ( iObj == iObj1 )
            Vec_IntPushUnique( vItems, iObj2 );
        else if ( iObj == iObj2 )
            Vec_IntPushUnique( vItems, iObj1 );
    // sort items by rank cost
    Vec_IntSelectSortCost( Vec_IntArray(vItems), Vec_IntSize(vItems), vRanks );
    return vItems;
}